

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O2

void __thiscall
duckdb::SplitStringMapOperation::HandleValue
          (SplitStringMapOperation *this,char *buf,idx_t start_pos,idx_t pos)

{
  string_t *psVar1;
  idx_t iVar2;
  bool bVar3;
  string_t sVar4;
  
  bVar3 = IsNull(buf,start_pos,pos);
  if (bVar3) {
    FlatVector::SetNull(this->varchar_val,*this->child_start,true);
  }
  else {
    sVar4 = HandleString<true>(this->varchar_val,buf,start_pos,pos);
    psVar1 = this->child_val_data;
    iVar2 = *this->child_start;
    *(long *)&psVar1[iVar2].value = sVar4.value._0_8_;
    psVar1[iVar2].value.pointer.ptr = sVar4.value._8_8_;
  }
  *this->child_start = *this->child_start + 1;
  return;
}

Assistant:

void HandleValue(const char *buf, idx_t start_pos, idx_t pos) {
		if (IsNull(buf, start_pos, pos)) {
			FlatVector::SetNull(varchar_val, child_start, true);
			child_start++;
			return;
		}
		child_val_data[child_start] = HandleString(varchar_val, buf, start_pos, pos);
		child_start++;
	}